

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# execmd.c
# Opt level: O0

void exe_get_tpl(voccxdef *ctx,objnum verb,uint *tplofs,uint *actofs)

{
  uint uVar1;
  uint *in_RCX;
  uint *in_RDX;
  undefined8 in_RDI;
  objnum *unaff_retaddr;
  int inh;
  
  inh = (int)((ulong)in_RDI >> 0x20);
  uVar1 = objgetap((mcmcxdef *)tplofs,actofs._6_2_,actofs._4_2_,unaff_retaddr,inh);
  *in_RDX = uVar1;
  if (*in_RDX == 0) {
    uVar1 = objgetap((mcmcxdef *)tplofs,actofs._6_2_,actofs._4_2_,unaff_retaddr,inh);
    *in_RDX = uVar1;
  }
  uVar1 = objgetap((mcmcxdef *)tplofs,actofs._6_2_,actofs._4_2_,unaff_retaddr,inh);
  *in_RCX = uVar1;
  return;
}

Assistant:

static void exe_get_tpl(voccxdef *ctx, objnum verb,
                        uint *tplofs, uint *actofs)
{
    /* look up the new-style template first */
    *tplofs = objgetap(ctx->voccxmem, verb, PRP_TPL2, (objnum *)0, FALSE);

    /* if there's no new-style template, look up the old-style template */
    if (*tplofs == 0)
        *tplofs = objgetap(ctx->voccxmem, verb, PRP_TPL, (objnum *)0, FALSE);

    /* also look to see if the verb has an Action method */
    *actofs = objgetap(ctx->voccxmem, verb, PRP_ACTION, (objnum *)0, FALSE);
}